

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::decompressTexture
               (vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                *levelDatas,
               vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
               *levelAccesses,RenderContext *renderContext,ImageInfo *info,
               vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               *data)

{
  bool bVar1;
  bool bVar2;
  deUint32 dVar3;
  ContextType ctxType;
  ApiType requiredApiType;
  int iVar4;
  int iVar5;
  IVec3 *v;
  ContextInfo *pCVar6;
  reference levelData_00;
  reference levelAccess_00;
  const_reference this;
  void *data_00;
  PixelBufferAccess *levelAccess;
  ArrayBuffer<unsigned_char,_1UL,_1UL> *levelData;
  IVec3 levelPixelSize;
  int level;
  TexDecompressionParams local_70;
  DefaultDeleter<glu::ContextInfo> local_69;
  TexDecompressionParams decompressParams;
  UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> ctxInfo;
  undefined1 local_48 [7];
  bool isES32;
  IVec3 size;
  TextureFormat decompressedFormat;
  CompressedTexFormat compressedFormat;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *data_local;
  ImageInfo *info_local;
  RenderContext *renderContext_local;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *levelAccesses_local;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *levelDatas_local;
  
  unique0x10000346 = data;
  dVar3 = ImageInfo::getFormat(info);
  decompressedFormat.order = glu::mapGLCompressedTexFormat(dVar3);
  size.m_data._4_8_ = tcu::getUncompressedFormat(decompressedFormat.order);
  v = ImageInfo::getSize(info);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)local_48,v);
  ctxType.super_ApiType.m_bits = (ApiType)(*renderContext->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  pCVar6 = glu::ContextInfo::create(renderContext);
  de::DefaultDeleter<glu::ContextInfo>::DefaultDeleter(&local_69);
  de::details::UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::UniquePtr
            ((UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)&decompressParams
             ,pCVar6);
  tcu::TexDecompressionParams::TexDecompressionParams(&local_70,ASTCMODE_LAST);
  bVar2 = tcu::isAstcFormat(decompressedFormat.order);
  if (bVar2) {
    pCVar6 = de::details::UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::
             operator->((UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)
                        &decompressParams);
    bVar2 = glu::ContextInfo::isExtensionSupported(pCVar6,"GL_KHR_texture_compression_astc_hdr");
    if ((!bVar2) || (bVar2 = tcu::isAstcSRGBFormat(decompressedFormat.order), bVar2)) {
      if (!bVar1) {
        pCVar6 = de::details::UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::
                 operator->((UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)
                            &decompressParams);
        bVar1 = glu::ContextInfo::isExtensionSupported(pCVar6,"GL_KHR_texture_compression_astc_ldr")
        ;
        if (!bVar1) goto LAB_009fa779;
      }
      tcu::TexDecompressionParams::TexDecompressionParams
                ((TexDecompressionParams *)(levelPixelSize.m_data + 2),ASTCMODE_LDR);
      local_70.astcMode = levelPixelSize.m_data[2];
    }
    else {
      tcu::TexDecompressionParams::TexDecompressionParams
                ((TexDecompressionParams *)&level,ASTCMODE_HDR);
      local_70.astcMode = level;
    }
  }
LAB_009fa779:
  iVar4 = getLevelCount(info);
  std::
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ::resize(levelDatas,(long)iVar4);
  iVar4 = getLevelCount(info);
  std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::resize
            (levelAccesses,(long)iVar4);
  for (levelPixelSize.m_data[1] = 0; iVar4 = levelPixelSize.m_data[1], iVar5 = getLevelCount(info),
      iVar4 < iVar5; levelPixelSize.m_data[1] = levelPixelSize.m_data[1] + 1) {
    dVar3 = ImageInfo::getTarget(info);
    getLevelSize((anon_unknown_0 *)((long)&levelData + 4),dVar3,(IVec3 *)local_48,
                 levelPixelSize.m_data[1]);
    levelData_00 = std::
                   vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                   ::operator[](levelDatas,(long)levelPixelSize.m_data[1]);
    levelAccess_00 =
         std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::operator[]
                   (levelAccesses,(long)levelPixelSize.m_data[1]);
    this = std::
           vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
           ::operator[](stack0xffffffffffffffd0,(long)levelPixelSize.m_data[1]);
    data_00 = de::ArrayBuffer<unsigned_char,_1UL,_1UL>::getPtr(this);
    decompressTextureLevel
              (&local_70,levelData_00,levelAccess_00,&decompressedFormat.order,
               (TextureFormat *)(size.m_data + 1),(IVec3 *)((long)&levelData + 4),data_00);
  }
  de::details::UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::~UniquePtr
            ((UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)&decompressParams
            );
  return;
}

Assistant:

void decompressTexture (vector<ArrayBuffer<deUint8> >&			levelDatas,
						vector<tcu::PixelBufferAccess>&			levelAccesses,
						glu::RenderContext&						renderContext,
						const ImageInfo&						info,
						const vector<ArrayBuffer<deUint8> >&	data)
{
	const tcu::CompressedTexFormat	compressedFormat	= glu::mapGLCompressedTexFormat(info.getFormat());
	const tcu::TextureFormat		decompressedFormat	= tcu::getUncompressedFormat(compressedFormat);
	const IVec3						size				= info.getSize();
	const bool						isES32				= glu::contextSupports(renderContext.getType(), glu::ApiType::es(3, 2));

	de::UniquePtr<glu::ContextInfo>	ctxInfo				(glu::ContextInfo::create(renderContext));
	tcu::TexDecompressionParams		decompressParams;

	if (tcu::isAstcFormat(compressedFormat))
	{
		if (ctxInfo->isExtensionSupported("GL_KHR_texture_compression_astc_hdr") && !tcu::isAstcSRGBFormat(compressedFormat))
			decompressParams = tcu::TexDecompressionParams(tcu::TexDecompressionParams::ASTCMODE_HDR);
		else if (isES32 || ctxInfo->isExtensionSupported("GL_KHR_texture_compression_astc_ldr"))
			decompressParams = tcu::TexDecompressionParams(tcu::TexDecompressionParams::ASTCMODE_LDR);
		else
			DE_ASSERT(false);
	}

	levelDatas.resize(getLevelCount(info));
	levelAccesses.resize(getLevelCount(info));

	for (int level = 0; level < getLevelCount(info); level++)
	{
		const IVec3					levelPixelSize	= getLevelSize(info.getTarget(), size, level);
		de::ArrayBuffer<deUint8>&	levelData		= levelDatas[level];
		tcu::PixelBufferAccess&		levelAccess		= levelAccesses[level];

		decompressTextureLevel(decompressParams, levelData, levelAccess, compressedFormat, decompressedFormat, levelPixelSize, data[level].getPtr());
	}
}